

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O3

int ngp_unread_line(void)

{
  if (ngp_curline.line == (char *)0x0) {
    return 0x16b;
  }
  if (ngp_prevline.line != (char *)0x0) {
    return 0x16c;
  }
  ngp_prevline.comment = ngp_curline.comment;
  ngp_prevline._40_8_ = ngp_curline._40_8_;
  ngp_prevline.value = ngp_curline.value;
  ngp_prevline._24_8_ = ngp_curline._24_8_;
  ngp_prevline.line = ngp_curline.line;
  ngp_prevline.name = ngp_curline.name;
  ngp_curline.line = (char *)0x0;
  return 0;
}

Assistant:

int	ngp_unread_line(void)
 {
   if (NULL == ngp_curline.line)		/* nothing to unread */
     return(NGP_EMPTY_CURLINE);

   if (NULL != ngp_prevline.line)		/* we cannot unread line twice */
     return(NGP_UNREAD_QUEUE_FULL);

   ngp_prevline = ngp_curline;
   ngp_curline.line = NULL;
   return(NGP_OK);
 }